

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProc.h
# Opt level: O2

void __thiscall ImageProc::smoothPerimeter(ImageProc *this,float smoothParam)

{
  int iVar1;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *this_00;
  pointer pPVar2;
  pointer pPVar3;
  pointer pPVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int j;
  int iVar8;
  float fVar11;
  float extraout_XMM0_Db;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Point2f pnt;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> splinePoints;
  Point_<float> local_c8;
  Point_<float> local_c0;
  Point_<float> local_b8;
  undefined1 local_b0 [8];
  _Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_a8;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Point_<float> local_68;
  undefined8 uStack_60;
  Point_<float> local_58;
  undefined8 uStack_50;
  Point_<float> local_48;
  undefined8 uStack_40;
  
  if ((smoothParam < 1.0) && (0.0 < smoothParam)) {
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pPVar2 = (this->BoundaryPoints).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar3 = (this->BoundaryPoints).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = (int)(1.0 / smoothParam + 1.0 / smoothParam);
    fVar11 = 0.0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    this_00 = &this->SmoothedBoundaryPoints;
    iVar6 = 0;
    local_88 = smoothParam;
    fStack_84 = smoothParam;
    fStack_80 = smoothParam;
    fStack_7c = smoothParam;
    while (auVar9._0_4_ = (float)iVar6,
          auVar9._0_4_ < (float)(ulong)((long)pPVar2 - (long)pPVar3 >> 3) * smoothParam + -3.0) {
      pPVar4 = (this->BoundaryPoints).
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = iVar6 + 1;
      auVar9._4_4_ = (float)iVar1;
      auVar9._8_4_ = fVar11;
      auVar9._12_4_ = 0;
      auVar5._4_4_ = fStack_84;
      auVar5._0_4_ = local_88;
      auVar5._8_4_ = fStack_80;
      auVar5._12_4_ = fStack_7c;
      auVar9 = divps(auVar9,auVar5);
      local_48 = pPVar4[(int)auVar9._0_4_];
      uStack_40 = 0;
      local_58 = pPVar4[(int)auVar9._4_4_];
      uStack_50._0_1_ = (Mat)0x0;
      uStack_50._1_7_ = 0;
      auVar10._0_4_ = (float)(iVar6 + 2);
      auVar10._4_4_ = (float)(iVar6 + 3);
      auVar10._8_8_ = 0;
      auVar9 = divps(auVar10,auVar5);
      local_68 = pPVar4[(int)auVar9._0_4_];
      uStack_60 = 0;
      local_78 = pPVar4[(int)auVar9._4_4_].x;
      fVar11 = pPVar4[(int)auVar9._4_4_].y;
      uStack_70 = 0;
      uStack_6c = 0;
      fStack_74 = fVar11;
      for (iVar8 = 0; iVar6 = iVar1, iVar7 != iVar8; iVar8 = iVar8 + 1) {
        local_b8 = local_48;
        local_c0 = local_58;
        local_c8 = local_68;
        pointOnCurve((ImageProc *)local_b0,(Point2f *)this,&local_b8,&local_c0,&local_c8,
                     (float)iVar8 * smoothParam * 0.5);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  (this_00,(value_type *)local_b0);
        fVar11 = extraout_XMM0_Db;
      }
    }
    local_b0 = *(undefined1 (*) [8])
                (this_00->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::
    emplace_back<cv::Point_<float>>
              ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)this_00,
               (Point_<float> *)local_b0);
    pPVar2 = (this->BoundaryPoints).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->BoundaryPoints).
        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar2) {
      (this->BoundaryPoints).
      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar2;
    }
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
              (&this->BoundaryPoints,this_00);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&local_a8);
  }
  return;
}

Assistant:

void smoothPerimeter(float smoothParam)
	{
		// if given params is out of range return unsmoothed version of perimeter
		if (smoothParam >= 1 || smoothParam <=0)
		{
			return;
		}
			
		std::vector<cv::Point2f> splinePoints;
		double stepsize=1/smoothParam;	
		float length= BoundaryPoints.size() * smoothParam;

		for (int i = 0; i < length - 3; i++)
		{
			cv::Point2f p0= BoundaryPoints[(int)(i/ smoothParam)]; 
			cv::Point2f p1 = BoundaryPoints[(int)((i+1) / smoothParam)];
			cv::Point2f p2 = BoundaryPoints[(int)((i+2) / smoothParam)];
			cv::Point2f p3 = BoundaryPoints[(int)((i+3) / smoothParam)];

			for (int j = 0; j < (int)(2*stepsize); j++)
			{
				//std::cout << j << " " ;
				cv::Point2f pnt= pointOnCurve(p0,  p1,  p2, p3, smoothParam/2*j);
				SmoothedBoundaryPoints.push_back(pnt);
			}
		}
		cv::Point2d first = SmoothedBoundaryPoints[0];
		SmoothedBoundaryPoints.push_back(first);

		BoundaryPoints.clear();		
		BoundaryPoints=SmoothedBoundaryPoints;
		
	}